

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh.cpp
# Opt level: O0

int __thiscall ncnn::TanH::forward_inplace(TanH *this,Mat *bottom_top_blob,Option *opt)

{
  long in_RSI;
  double dVar1;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  float *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  Mat local_78;
  float *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = *(int *)(in_RSI + 0x34);
  local_28 = local_1c * local_20;
  for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    in_stack_ffffffffffffff70 = Mat::operator_cast_to_float_(&local_78);
    Mat::~Mat((Mat *)0x173a83);
    local_38 = in_stack_ffffffffffffff70;
    for (in_stack_ffffffffffffff78 = 0; in_stack_ffffffffffffff78 < local_28;
        in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 + 1) {
      dVar1 = std::tanh((double)(ulong)(uint)local_38[in_stack_ffffffffffffff78]);
      local_38[in_stack_ffffffffffffff78] = SUB84(dVar1,0);
    }
  }
  return 0;
}

Assistant:

int TanH::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            ptr[i] = tanh(ptr[i]);
        }
    }

    return 0;
}